

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O0

void write_crl(scep *s)

{
  int iVar1;
  OPENSSL_STACK *pOVar2;
  FILE *local_30;
  FILE *fp;
  X509_CRL *crl;
  stack_st_X509_CRL *crls;
  PKCS7 *p7;
  scep *s_local;
  
  crls = (stack_st_X509_CRL *)s->reply_p7;
  crl = (X509_CRL *)((((PKCS7 *)crls)->d).sign)->crl;
  p7 = (PKCS7 *)s;
  pOVar2 = ossl_check_const_X509_CRL_sk_type((stack_st_X509_CRL *)crl);
  fp = (FILE *)OPENSSL_sk_value(pOVar2,0);
  if (fp == (FILE *)0x0) {
    log_log(4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/fileutils.c"
            ,0x1e,"cannot find CRL in reply");
    exit(0x5d);
  }
  iVar1 = fopen_s((FILE **)&local_30,w_char,"w");
  if (iVar1 != 0) {
    log_log(4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/fileutils.c"
            ,0x24,"cannot open CRL file for writing");
    exit(0x5d);
  }
  log_log(1,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/fileutils.c"
          ,0x27,"writing CRL");
  if (d_flag != 0) {
    PEM_write_X509_CRL(_stdout,(X509_CRL *)fp);
  }
  iVar1 = PEM_write_X509_CRL(local_30,(X509_CRL *)fp);
  if (iVar1 != 1) {
    log_log(4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/fileutils.c"
            ,0x2a,"error while writing CRL file");
    ERR_print_errors_fp(_stderr);
    exit(0x5d);
  }
  log_log(2,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/fileutils.c"
          ,0x2e,"CRL written as %s",w_char);
  fclose(local_30);
  return;
}

Assistant:

void write_crl(struct scep *s) {
    PKCS7               *p7;
    STACK_OF(X509_CRL)  *crls;
    X509_CRL            *crl;
    FILE                *fp;

    // Get CRL
    p7 = s->reply_p7;
    crls = p7->d.sign->crl;

    // We expect only one CRL:
    crl = sk_X509_CRL_value(crls, 0);
    if (crl == NULL) {
        log_error("cannot find CRL in reply");
        exit (SCEP_PKISTATUS_FILE);
    }

    // Write PEM-formatted file:
    if (fopen_s(&fp, w_char, "w")) {
        log_error("cannot open CRL file for writing");
        exit (SCEP_PKISTATUS_FILE);
    }
    log_debug("writing CRL");
    if (d_flag) PEM_write_X509_CRL(stdout, crl);
    if (PEM_write_X509_CRL(fp, crl) != 1) {
        log_error("error while writing CRL file");
        ERR_print_errors_fp(stderr);
        exit (SCEP_PKISTATUS_FILE);
    }
    log_info("CRL written as %s", w_char);
    fclose(fp);
}